

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O2

void __thiscall dlib::logger::logger(logger *this,string *name_)

{
  string *name;
  bool bVar1;
  global_data *pgVar2;
  streambuf *psVar3;
  print_header_type p_Var4;
  auto_mutex M;
  logger *temp;
  mfp_kernel_1_base_class<4UL> local_58;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_00331f08;
  pgVar2 = get_global_data();
  this->gd = pgVar2;
  name = &this->logger_name;
  std::__cxx11::string::string((string *)name,(string *)name_);
  psVar3 = global_data::output_streambuf(this->gd,name);
  std::ostream::ostream(&this->out,psVar3);
  global_data::level(&this->cur_level,this->gd,name);
  (this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.data = &this->hook;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 8) = 0;
  *(undefined4 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x10) = 2;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x18) = 0;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x20) = 0;
  (this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem.void_ptr =
       &PTR__mp_base_base_00331f38;
  M.r = &this->gd->m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  temp = this;
  set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::add(&this->gd->loggers,&temp);
  p_Var4 = global_data::logger_header(this->gd,name);
  this->print_header = p_Var4;
  bVar1 = global_data::auto_flush(this->gd,name);
  this->auto_flush_enabled = bVar1;
  global_data::output_hook((hook_mfp *)&local_58,this->gd,name);
  mfp_kernel_1_base_class<4UL>::operator=
            (&(this->hook).super_mfp_kernel_1_base_class<4UL>,&local_58);
  (*(code *)**local_58.mp_memory.data)();
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

logger::
    logger (  
        const std::string& name_
    ) : 
        gd(get_global_data()),
        logger_name(name_),
        out(gd.output_streambuf(logger_name)),
        cur_level(gd.level(logger_name))
    {
        DLIB_ASSERT(name_[0] != '\0',
                    "\tlogger::logger()"
                    << "\n\tYou can't make a logger with an empty name"
                    << "\n\tthis: " << this
        );

        auto_mutex M(gd.m);
        logger* temp = this;
        gd.loggers.add(temp);

        // load the appropriate settings
        print_header        = gd.logger_header(logger_name);
        auto_flush_enabled  = gd.auto_flush(logger_name);
        hook                = gd.output_hook(logger_name);
    }